

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseVersionInfo(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr in;
  xmlChar *pxVar2;
  xmlParserErrors error;
  
  in = ctxt->input;
  pxVar2 = in->cur;
  if ((((*pxVar2 != 'v') || (pxVar2[1] != 'e')) || (pxVar2[2] != 'r')) ||
     (((pxVar2[3] != 's' || (pxVar2[4] != 'i')) || ((pxVar2[5] != 'o' || (pxVar2[6] != 'n')))))) {
    return (xmlChar *)0x0;
  }
  in->cur = pxVar2 + 7;
  in->col = in->col + 7;
  if (pxVar2[7] == '\0') {
    xmlParserInputGrow(in,0xfa);
  }
  xmlSkipBlankChars(ctxt);
  if (*ctxt->input->cur == '=') {
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
    xVar1 = *ctxt->input->cur;
    if (xVar1 == '\'') {
      xmlNextChar(ctxt);
      pxVar2 = xmlParseVersionNum(ctxt);
      if (*ctxt->input->cur != '\'') {
LAB_001637b3:
        error = XML_ERR_STRING_NOT_CLOSED;
        goto LAB_001637c8;
      }
    }
    else {
      if (xVar1 != '\"') {
        pxVar2 = (xmlChar *)0x0;
        error = XML_ERR_STRING_NOT_STARTED;
        goto LAB_001637c8;
      }
      xmlNextChar(ctxt);
      pxVar2 = xmlParseVersionNum(ctxt);
      if (*ctxt->input->cur != '\"') goto LAB_001637b3;
    }
    xmlNextChar(ctxt);
  }
  else {
    pxVar2 = (xmlChar *)0x0;
    error = XML_ERR_EQUAL_REQUIRED;
LAB_001637c8:
    xmlFatalErr(ctxt,error,(char *)0x0);
  }
  return pxVar2;
}

Assistant:

xmlChar *
xmlParseVersionInfo(xmlParserCtxtPtr ctxt) {
    xmlChar *version = NULL;

    if (CMP7(CUR_PTR, 'v', 'e', 'r', 's', 'i', 'o', 'n')) {
	SKIP(7);
	SKIP_BLANKS;
	if (RAW != '=') {
	    xmlFatalErr(ctxt, XML_ERR_EQUAL_REQUIRED, NULL);
	    return(NULL);
        }
	NEXT;
	SKIP_BLANKS;
	if (RAW == '"') {
	    NEXT;
	    version = xmlParseVersionNum(ctxt);
	    if (RAW != '"') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
	    } else
	        NEXT;
	} else if (RAW == '\''){
	    NEXT;
	    version = xmlParseVersionNum(ctxt);
	    if (RAW != '\'') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
	    } else
	        NEXT;
	} else {
	    xmlFatalErr(ctxt, XML_ERR_STRING_NOT_STARTED, NULL);
	}
    }
    return(version);
}